

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavRestoreLayer(int layer)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *g;
  int layer_local;
  
  pIVar1 = GImGui;
  GImGui->NavLayer = layer;
  if (layer == 0) {
    pIVar2 = NavRestoreLastChildNavWindow(pIVar1->NavWindow);
    pIVar1->NavWindow = pIVar2;
    if (pIVar1->NavWindow->NavLastIds[0] != 0) {
      SetNavIDWithRectRel(pIVar1->NavWindow->NavLastIds[0],0,pIVar1->NavWindow->NavRectRel);
      return;
    }
  }
  ImGui::NavInitWindow(pIVar1->NavWindow,true);
  return;
}

Assistant:

static void NavRestoreLayer(int layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    if (layer == 0 && g.NavWindow->NavLastIds[0] != 0)
        SetNavIDWithRectRel(g.NavWindow->NavLastIds[0], layer, g.NavWindow->NavRectRel[0]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}